

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zap.c
# Opt level: O3

int zapyourself(obj *obj,boolean ordinary)

{
  ushort uVar1;
  obj *obj_00;
  boolean bVar2;
  uint uVar3;
  uint uVar4;
  obj **ppoVar5;
  obj *poVar6;
  char *pcVar7;
  int tmp_2;
  int iVar8;
  int iVar9;
  int tmp;
  int iVar10;
  long incr;
  char *line;
  int iVar11;
  bool bVar12;
  char buf [256];
  obj *local_130;
  obj *local_128 [32];
  
  uVar1 = obj->otyp;
  iVar8 = 1;
  if (uVar1 < 0x17d) {
    if (uVar1 != 0xea) {
      if (uVar1 != 0xff) {
        if (uVar1 == 0x100) goto LAB_0029446a;
        goto switchD_00294115_caseD_183;
      }
      goto switchD_00294115_caseD_180;
    }
LAB_00294970:
    uVar3 = mt_random();
    bVar2 = resists_blnd(&youmonst);
    if (bVar2 != '\0') {
      return 0;
    }
    pline("You are blinded by the flash!");
    make_blinded((long)(int)(iVar8 + uVar3 % 0x19),'\0');
    discover_object((int)obj->otyp,'\x01','\x01');
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_002949fb;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_002949f2;
    }
    else {
LAB_002949f2:
      if (ublindf == (obj *)0x0) {
        return 0;
      }
LAB_002949fb:
      if (ublindf->oartifact != '\x1d') {
        return 0;
      }
    }
    pcVar7 = "Your vision quickly clears.";
    goto LAB_00294930;
  }
  switch(uVar1) {
  case 0x17d:
  case 0x18c:
  case 0x194:
  case 0x1c3:
  case 0x1cd:
  case 0x1cf:
    return 0;
  case 0x17f:
    pline("You explode a fireball on top of yourself!");
    iVar10 = (int)u.ux;
    iVar9 = (int)u.uy;
    iVar8 = 6;
    iVar11 = -6;
    do {
      uVar3 = mt_random();
      iVar8 = iVar8 + uVar3 % 6;
      iVar11 = iVar11 + 1;
    } while (iVar11 != 0);
    explode(iVar10,iVar9,0xb,iVar8,'\v',5);
    return 0;
  case 0x182:
  case 0x1d4:
    if ((((youmonst.data)->mlet != '7') && (((youmonst.data)->mflags2 & 2) == 0)) &&
       ((youmonst.data != mons + 0x33 && (youmonst.data)->mlet != '\x16') &&
        ((youmonst.data)->mflags2 >> 9 & 1) == 0)) {
      sprintf((char *)local_128,"shot %sself with a death ray",
              *(undefined8 *)((long)&genders[0].him + (ulong)((uint)(flags.female != '\0') * 0x30)))
      ;
      killer_format = 2;
      killer = (char *)local_128;
      pline("You irradiate yourself with pure energy!");
      pline("You die.");
      discover_object((int)obj->otyp,'\x01','\x01');
      done(0);
      return 0;
    }
    pcVar7 = "You seem no deader than before.";
    if (uVar1 == 0x1d4) {
      pcVar7 = "The wand shoots an apparently harmless beam at you.";
    }
    break;
  default:
switchD_00294115_caseD_183:
    warning("object %d used?");
    return 0;
  case 0x185:
  case 0x196:
    iVar8 = 6;
    iVar10 = -6;
    do {
      uVar3 = mt_random();
      iVar8 = iVar8 + (uVar3 & (uint)(uVar1 == 0x196) * 4 + 3);
      iVar10 = iVar10 + 1;
    } while (iVar10 != 0);
    healup(iVar8,0,'\0',obj->otyp == 0x196);
    pcVar7 = "";
    if (obj->otyp == 0x196) {
      pcVar7 = "much ";
    }
    line = "You feel %sbetter.";
    goto LAB_0029429c;
  case 0x18a:
    if (u.uprops[0x35].extrinsic != 0 || u.uprops[0x35].intrinsic != 0) {
      return 0;
    }
    bVar2 = resists_drli(&youmonst);
    if (bVar2 != '\0') {
      return 0;
    }
    losexp("life drainage");
    goto LAB_002942c4;
  case 0x18b:
  case 0x1c6:
    if ((u.uprops[0x1a].intrinsic & 0x7ffffff) == 0) {
      return 0;
    }
    u_slow_down();
LAB_002942c4:
    discover_object((int)obj->otyp,'\x01','\x01');
    return 0;
  case 0x19e:
    goto switchD_00294115_caseD_19e;
  case 0x19f:
  case 0x1cb:
    tele((char *)0x0);
    return 0;
  case 0x1a1:
  case 0x1ca:
    cancel_monst(&youmonst,obj,'\x01','\0','\x01');
    return 0;
  case 0x1a4:
    if (u.umonnum == 0x108) {
      polymon(0x106);
    }
    obj_00 = invent;
    poVar6 = invent;
    if (u.uprops[0x21].intrinsic != 0) {
      fix_petrification();
      obj_00 = invent;
      poVar6 = invent;
    }
    while (invent = poVar6, obj_00 != (obj *)0x0) {
      poVar6 = obj_00->nobj;
      local_130 = poVar6;
      bhito(obj_00,obj);
      obj_00 = poVar6;
      poVar6 = invent;
    }
    if (poVar6 == (obj *)0x0) {
      return 0;
    }
    do {
      local_130 = poVar6->nobj;
      local_128[0] = poVar6;
      if (local_130 == (obj *)0x0) {
        return 0;
      }
      do {
        iVar8 = merged(local_128,&local_130);
        poVar6 = invent;
        if (iVar8 != 0) goto LAB_002945b8;
        local_130 = local_130->nobj;
      } while (local_130 != (obj *)0x0);
      poVar6 = local_128[0]->nobj;
LAB_002945b8:
      if (poVar6 == (obj *)0x0) {
        return 0;
      }
    } while( true );
  case 0x1be:
    iVar9 = (int)obj->spe;
    iVar10 = iVar9;
    if (obj->spe != '\0') {
      do {
        uVar3 = mt_random();
        iVar9 = iVar9 + uVar3 % 0x19;
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
      iVar8 = iVar9 + 1;
    }
    goto LAB_00294970;
  case 0x1c4:
    discover_object(0x1c4,'\x01','\x01');
  case 0x187:
    if ((u.uprops[0x2c].extrinsic == 0) &&
       ((u.umonnum == u.umonster || (bVar2 = resists_magm(&youmonst), bVar2 == '\0')))) {
      if (ordinary == '\0') {
        iVar8 = obj->spe + 1;
        iVar9 = 0;
        for (iVar10 = iVar8; iVar10 != 0; iVar10 = iVar10 + -1) {
          uVar3 = mt_random();
          iVar8 = iVar8 + uVar3 % 6;
          iVar9 = iVar8;
        }
      }
      else {
        pline("You bash yourself!");
        iVar9 = 2;
        iVar8 = -2;
        do {
          uVar3 = mt_random();
          iVar9 = iVar9 + uVar3 % 0xc;
          iVar8 = iVar8 + 1;
        } while (iVar8 != 0);
      }
      exercise(0,'\0');
      return iVar9;
    }
    shieldeff(u.ux,u.uy);
    pcVar7 = "Boing!";
    break;
  case 0x1c5:
    if (u.uprops[0xd].blocked == 0 &&
        ((youmonst.data == mons + 0x7b || youmonst.data == mons + 0x9e) ||
        (u.uprops[0xd].extrinsic != 0 || u.uprops[0xd].intrinsic != 0))) {
      bVar12 = false;
      goto LAB_00294d10;
    }
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00294444;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0029443f;
LAB_00294cdf:
      bVar12 = u.uprops[0xd].blocked == 0;
    }
    else {
LAB_0029443f:
      if (ublindf != (obj *)0x0) {
LAB_00294444:
        if (ublindf->oartifact == '\x1d') goto LAB_00294cdf;
      }
      bVar12 = false;
    }
    if ((u.uprops[0xd].blocked == 0) || (uarmc->otyp != 0x7c)) {
LAB_00294d10:
      if ((ordinary == '\0') &&
         (uVar3 = mt_random(),
         0x19999999 < (uVar3 * -0x33333333 >> 1 | (uint)((uVar3 * -0x33333333 & 1) != 0) << 0x1f)))
      {
        iVar10 = (int)obj->spe;
        iVar8 = iVar10;
        if (obj->spe == '\0') {
          incr = 0;
        }
        else {
          do {
            uVar3 = mt_random();
            iVar10 = iVar10 + uVar3 % 0xfa;
            iVar8 = iVar8 + -1;
          } while (iVar8 != 0);
          incr = (long)iVar10;
        }
        incr_itimeout(&u.uprops[0xd].intrinsic,incr);
      }
      else {
        u.uprops[0xd].intrinsic = u.uprops[0xd].intrinsic | 0x4000000;
      }
      if (!bVar12) {
        return 0;
      }
      discover_object(0x1c5,'\x01','\x01');
      newsym((int)u.ux,(int)u.uy);
      self_invis_message();
      return 0;
    }
    pcVar7 = xname(uarmc);
    line = "You feel rather itchy under your %s.";
LAB_0029429c:
    pline(line,pcVar7);
    return 0;
  case 0x1c7:
    if ((u.uprops[0x1a].intrinsic & 0x7000000) == 0) {
      pcVar7 = "You speed up.";
      if (u.uprops[0x1a].intrinsic != 0 || u.uprops[0x1a].extrinsic != 0) {
        pcVar7 = "Your quickness feels more natural.";
      }
      pline(pcVar7);
      discover_object(0x1c7,'\x01','\x01');
      exercise(3,'\x01');
    }
    u.uprops[0x1a].intrinsic = u.uprops[0x1a].intrinsic | 0x4000000;
    return 0;
  case 0x1c8:
    discover_object(0x1c8,'\x01','\x01');
  case 0x19d:
    unturn_dead(&youmonst);
    if (((youmonst.data)->mflags2 & 2) != 0) {
      pline("You feel frightened and %sstunned.");
      uVar3 = u.uprops[0x1b].intrinsic;
      uVar4 = mt_random();
      make_stunned((ulong)(uVar3 + uVar4 / 0x1e + uVar4 / 0x1e + (uVar4 / 0x1e) * -0x20 + uVar4 + 1)
                   ,'\0');
      return 0;
    }
    pcVar7 = "You shudder in dread.";
    break;
  case 0x1c9:
    if (u.uprops[0x3d].extrinsic == 0 && u.uprops[0x3d].intrinsic == 0) {
      discover_object(0x1c9,'\x01','\x01');
    }
    goto switchD_00294115_caseD_19e;
  case 0x1cc:
    if (uball == (obj *)0x0) {
      return 0;
    }
    discover_object(0x1cc,'\x01','\x01');
  case 0x186:
    if (uball == (obj *)0x0) {
      return 0;
    }
    pcVar7 = "Your chain quivers for a moment.";
    break;
  case 0x1ce:
    if (u.umonnum != u.umonster) {
      discover_randomized_dragon(youmonst.data,"You discover that you are %s.");
    }
    ppoVar5 = &invent;
    while (ppoVar5 = &((obj *)ppoVar5)->nobj->nobj, (obj *)ppoVar5 != (obj *)0x0) {
      ((obj *)ppoVar5)->field_0x4a = ((obj *)ppoVar5)->field_0x4a | 0x20;
    }
    discover_object(0x1ce,'\x01','\x01');
    ustatusline();
    return 0;
  case 0x1d0:
    discover_object(0x1d0,'\x01','\x01');
  case 0x17e:
    pline("You\'ve shot yourself!");
    sprintf((char *)local_128,"shot %sself with a magic missile",
            *(undefined8 *)((long)&genders[0].him + (ulong)((uint)(flags.female != '\0') * 0x30)));
    iVar10 = 4;
    iVar8 = -4;
    do {
      uVar3 = mt_random();
      iVar10 = iVar10 + uVar3 % 6;
      iVar8 = iVar8 + 1;
    } while (iVar8 != 0);
    mana_damageu(iVar10,(monst *)0x0,(char *)local_128,2,'\x01');
    return 0;
  case 0x1d1:
    discover_object(0x1d1,'\x01','\x01');
LAB_0029446a:
    pline("You\'ve set yourself afire!");
    sprintf((char *)local_128,"shot %sself with a bolt of fire",
            *(undefined8 *)((long)&genders[0].him + (ulong)((uint)(flags.female != '\0') * 0x30)));
    iVar10 = 0xc;
    iVar8 = -0xc;
    do {
      uVar3 = mt_random();
      iVar10 = iVar10 + uVar3 % 6;
      iVar8 = iVar8 + 1;
    } while (iVar8 != 0);
    fire_damageu(iVar10,(monst *)0x0,(char *)local_128,2,0x14,'\x01','\0');
    return 0;
  case 0x1d2:
    discover_object(0x1d2,'\x01','\x01');
  case 0x180:
switchD_00294115_caseD_180:
    pline("You imitate a popsicle!");
    pcVar7 = "bolt";
    if (obj->otyp == 0x180) {
      pcVar7 = "cone";
    }
    sprintf((char *)local_128,"shot %sself with a %s of cold",
            *(undefined8 *)((long)&genders[0].him + (ulong)((uint)(flags.female != '\0') * 0x30)),
            pcVar7);
    iVar10 = 0xc;
    iVar8 = -0xc;
    do {
      uVar3 = mt_random();
      iVar10 = iVar10 + uVar3 % 6;
      iVar8 = iVar8 + 1;
    } while (iVar8 != 0);
    cold_damageu(iVar10,(monst *)0x0,(char *)local_128,2,0x14);
    return 0;
  case 0x1d3:
    discover_object(0x1d3,'\x01','\x01');
  case 0x181:
    if ((((u.uprops[3].intrinsic == 0 && u.uprops[3].extrinsic == 0) ||
         (((u.uprops[3].intrinsic >> 0x1a & 1) != 0 &&
          ((u.uprops[3].intrinsic & 0xfbffffff) == 0 && u.uprops[3].extrinsic == 0)))) &&
        (((byte)youmonst.mintrinsics & 4) == 0)) && (u.uprops[0x38].extrinsic == 0)) {
      pline("The sleep ray hits you!");
      uVar3 = 0x32;
      if ((((u.uprops[3].intrinsic >> 0x1a & 1) != 0) &&
          ((u.uprops[3].intrinsic & 0xfbffffff) == 0 && u.uprops[3].extrinsic == 0)) &&
         (((byte)youmonst.mintrinsics & 4) == 0)) {
        uVar3 = 0x32;
        if (u.uprops[0x38].extrinsic == 0) {
          uVar3 = 0x19;
        }
      }
      uVar4 = mt_random();
      fall_asleep(~(uVar4 % uVar3),'\x01');
      return 0;
    }
    shieldeff(u.ux,u.uy);
    pcVar7 = "You don\'t feel sleepy!";
    break;
  case 0x1d5:
    discover_object(0x1d5,'\x01','\x01');
    pline("You shock yourself!");
    sprintf((char *)local_128,"show %sself with a bolt of lightning",
            *(undefined8 *)((long)&genders[0].him + (ulong)((uint)(flags.female != '\0') * 0x30)));
    iVar10 = 0xc;
    iVar8 = -0xc;
    do {
      uVar3 = mt_random();
      iVar10 = iVar10 + uVar3 % 6;
      iVar8 = iVar8 + 1;
    } while (iVar8 != 0);
    elec_damageu(iVar10,(monst *)0x0,(char *)local_128,2,0x14,'\x01');
    return 0;
  }
LAB_00294930:
  pline(pcVar7);
  return 0;
switchD_00294115_caseD_19e:
  if (u.uprops[0x3d].extrinsic != 0 || u.uprops[0x3d].intrinsic != 0) {
    return 0;
  }
  polyself('\0');
  return 0;
}

Assistant:

int zapyourself(struct obj *obj, boolean ordinary)
{
	int	damage = 0;
	char buf[BUFSZ];

	switch(obj->otyp) {
		case WAN_STRIKING:
		    makeknown(WAN_STRIKING);
		case SPE_FORCE_BOLT:
		    if (Antimagic) {
			shieldeff(u.ux, u.uy);
			pline("Boing!");
		    } else {
			if (ordinary) {
			    pline("You bash yourself!");
			    damage = dice(2,12);
			} else
			    damage = dice(1 + obj->spe,6);
			exercise(A_STR, FALSE);
		    }
		    break;

		case WAN_LIGHTNING:
		    makeknown(WAN_LIGHTNING);
		    pline("You shock yourself!");
		    sprintf(buf, "show %sself with a bolt of lightning", uhim());
		    elec_damageu(dice(12, 6), NULL, buf, NO_KILLER_PREFIX, 20, TRUE);
		    break;

		case SPE_FIREBALL:
		    pline("You explode a fireball on top of yourself!");
		    explode(u.ux, u.uy, 11, dice(6,6), WAND_CLASS, EXPL_FIERY);
		    break;
		case WAN_FIRE:
		    makeknown(WAN_FIRE);
		case FIRE_HORN:
		    pline("You've set yourself afire!");
		    sprintf(buf, "shot %sself with a bolt of fire", uhim());
		    fire_damageu(dice(12, 6), NULL, buf, NO_KILLER_PREFIX,
				 20, TRUE, FALSE);
		    break;

		case WAN_COLD:
		    makeknown(WAN_COLD);
		case SPE_CONE_OF_COLD:
		case FROST_HORN:
		    pline("You imitate a popsicle!");
		    sprintf(buf, "shot %sself with a %s of cold", uhim(),
			    obj->otyp == SPE_CONE_OF_COLD ? "cone" : "bolt");
		    cold_damageu(dice(12, 6), NULL, buf, NO_KILLER_PREFIX, 20);
		    break;

		case WAN_MAGIC_MISSILE:
		    makeknown(WAN_MAGIC_MISSILE);
		case SPE_MAGIC_MISSILE:
		    pline("You've shot yourself!");
		    sprintf(buf, "shot %sself with a magic missile", uhim());
		    mana_damageu(dice(4, 6), NULL, buf, NO_KILLER_PREFIX, TRUE);
		    break;

		case WAN_POLYMORPH:
		    if (!Unchanging)
		    	makeknown(WAN_POLYMORPH);
		case SPE_POLYMORPH:
		    if (!Unchanging)
		    	polyself(FALSE);
		    break;

		case WAN_CANCELLATION:
		case SPE_CANCELLATION:
		    cancel_monst(&youmonst, obj, TRUE, FALSE, TRUE);
		    break;

		case SPE_DRAIN_LIFE:
			if (!Drain_resistance) {
				losexp("life drainage");
				makeknown(obj->otyp);
			}
			damage = 0;	/* No additional damage */
			break;

		case WAN_MAKE_INVISIBLE: {
		    /* have to test before changing HInvis but must change
		     * HInvis before doing newsym().
		     */
		    int msg = !Invis && !Blind && !BInvis;

		    if (BInvis && uarmc->otyp == MUMMY_WRAPPING) {
			/* A mummy wrapping absorbs it and protects you */
		        pline("You feel rather itchy under your %s.", xname(uarmc));
		        break;
		    }
		    if (ordinary || !rn2(10)) {	/* permanent */
			HInvis |= FROMOUTSIDE;
		    } else {			/* temporary */
		    	incr_itimeout(&HInvis, dice(obj->spe, 250));
		    }
		    if (msg) {
			makeknown(WAN_MAKE_INVISIBLE);
			newsym(u.ux, u.uy);
			self_invis_message();
		    }
		    break;
		}

		case WAN_SPEED_MONSTER:
		    if (!(HFast & INTRINSIC)) {
			if (!Fast)
			    pline("You speed up.");
			else
			    pline("Your quickness feels more natural.");
			makeknown(WAN_SPEED_MONSTER);
			exercise(A_DEX, TRUE);
		    }
		    HFast |= FROMOUTSIDE;
		    break;

		case WAN_SLEEP:
		    makeknown(WAN_SLEEP);
		case SPE_SLEEP:
		    if (FSleep_resistance) {
			shieldeff(u.ux, u.uy);
			pline("You don't feel sleepy!");
		    } else {
			pline("The sleep ray hits you!");
			fall_asleep(-rnd(PSleep_resistance ? 25 : 50), TRUE);
		    }
		    break;

		case WAN_SLOW_MONSTER:
		case SPE_SLOW_MONSTER:
		    if (HFast & (TIMEOUT | INTRINSIC)) {
			u_slow_down();
			makeknown(obj->otyp);
		    }
		    break;

		case WAN_TELEPORTATION:
		case SPE_TELEPORT_AWAY:
		    tele(NULL);
		    break;

		case WAN_DEATH:
		case SPE_FINGER_OF_DEATH:
		    if (nonliving(youmonst.data) || is_demon(youmonst.data)) {
			pline((obj->otyp == WAN_DEATH) ?
			  "The wand shoots an apparently harmless beam at you."
			  : "You seem no deader than before.");
			break;
		    }
		    sprintf(buf, "shot %sself with a death ray", uhim());
		    killer = buf;
		    killer_format = NO_KILLER_PREFIX;
		    pline("You irradiate yourself with pure energy!");
		    pline("You die.");
		    makeknown(obj->otyp);
			/* They might survive with an amulet of life saving */
		    done(DIED);
		    break;
		case WAN_UNDEAD_TURNING:
		    makeknown(WAN_UNDEAD_TURNING);
		case SPE_TURN_UNDEAD:
		    unturn_dead(&youmonst);
		    if (is_undead(youmonst.data)) {
			pline("You feel frightened and %sstunned.",
			     Stunned ? "even more " : "");
			make_stunned(HStun + rnd(30), FALSE);
		    } else
			pline("You shudder in dread.");
		    break;
		case SPE_HEALING:
		case SPE_EXTRA_HEALING:
		    healup(dice(6, obj->otyp == SPE_EXTRA_HEALING ? 8 : 4),
			   0, FALSE, (obj->otyp == SPE_EXTRA_HEALING));
		    pline("You feel %sbetter.",
			obj->otyp == SPE_EXTRA_HEALING ? "much " : "");
		    break;
		case WAN_LIGHT:	/* (broken wand) */
		 /* assert( !ordinary ); */
		    damage = dice(obj->spe, 25);
		case EXPENSIVE_CAMERA:
		    damage += rnd(25);
		    if (!resists_blnd(&youmonst)) {
			pline(blinded_by_the_flash);
			make_blinded((long)damage, FALSE);
			makeknown(obj->otyp);
			if (!Blind) pline("Your vision quickly clears.");
		    }
		    damage = 0;	/* reset */
		    break;
		case WAN_OPENING:
		    if (Punished) makeknown(WAN_OPENING);
		case SPE_KNOCK:
		    if (Punished) pline("Your chain quivers for a moment.");
		    break;
		case WAN_DIGGING:
		case SPE_DIG:
		case SPE_DETECT_UNSEEN:
		case WAN_NOTHING:
		case WAN_LOCKING:
		case SPE_WIZARD_LOCK:
		    break;
		case WAN_PROBING:
		    if (Upolyd) {
			discover_randomized_dragon(youmonst.data,
				"You discover that you are %s.");
		    }
		    for (obj = invent; obj; obj = obj->nobj)
			obj->dknown = 1;
		    /* note: `obj' reused; doesn't point at wand anymore */
		    makeknown(WAN_PROBING);
		    ustatusline();
		    break;
		case SPE_STONE_TO_FLESH:
		    {
		    struct obj *otemp, *onext;
		    boolean didmerge;

		    if (u.umonnum == PM_STONE_GOLEM)
			polymon(PM_FLESH_GOLEM);
		    if (Stoned) fix_petrification();	/* saved! */
		    /* but at a cost.. */
		    for (otemp = invent; otemp; otemp = onext) {
			onext = otemp->nobj;
			bhito(otemp, obj);
			}
		    /*
		     * It is possible that we can now merge some inventory.
		     * Do a higly paranoid merge.  Restart from the beginning
		     * until no merges.
		     */
		    do {
			didmerge = FALSE;
			for (otemp = invent; !didmerge && otemp; otemp = otemp->nobj)
			    for (onext = otemp->nobj; onext; onext = onext->nobj)
			    	if (merged(&otemp, &onext)) {
			    		didmerge = TRUE;
			    		break;
			    		}
		    } while (didmerge);
		    }
		    break;
		default: warning("object %d used?",obj->otyp);
		    break;
	}
	return damage;
}